

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O3

rf_image *
rf_image_alpha_mask_to_buffer
          (rf_image *__return_storage_ptr__,rf_image image,rf_image alpha_mask,void *dst,
          rf_int dst_size)

{
  ulong uVar1;
  char *pcVar2;
  ulong uVar3;
  undefined8 uVar4;
  long in_FS_OFFSET;
  
  __return_storage_ptr__->data = (void *)0x0;
  __return_storage_ptr__->width = 0;
  __return_storage_ptr__->height = 0;
  __return_storage_ptr__->format = 0;
  __return_storage_ptr__->valid = false;
  *(undefined3 *)&__return_storage_ptr__->field_0x15 = 0;
  uVar1 = (ulong)image.valid;
  uVar3 = (ulong)alpha_mask.valid;
  if ((image.valid == true) &&
     (((undefined1  [24])alpha_mask & (undefined1  [24])0x100000000) != (undefined1  [24])0x0)) {
    uVar1 = (ulong)(uint)alpha_mask.width;
    if ((image.width == alpha_mask.width) && (image.height == alpha_mask.height)) {
      uVar1 = (ulong)image.format;
      uVar3 = (ulong)alpha_mask.format;
      if (alpha_mask.format == RF_UNCOMPRESSED_GRAYSCALE &&
          image.format - RF_COMPRESSED_DXT1_RGB < 0xb) {
        if (dst_size < image.height * image.width * 2) {
          return __return_storage_ptr__;
        }
        __return_storage_ptr__->data = dst;
        __return_storage_ptr__->width = image.width;
        __return_storage_ptr__->height = image.height;
        __return_storage_ptr__->format = RF_UNCOMPRESSED_GRAY_ALPHA;
        __return_storage_ptr__->valid = true;
        return __return_storage_ptr__;
      }
      uVar4 = 0x3ed8;
      pcVar2 = "Expected compressed pixel formats. `image.format`: %d, `alpha_mask.format`: %d";
    }
    else {
      uVar3 = (ulong)(uint)alpha_mask.height;
      uVar4 = 0x3ed9;
      pcVar2 = "Alpha mask must be same size as image but was w: %d, h: %d";
    }
  }
  else {
    uVar4 = 0x3eda;
    pcVar2 = "One image was invalid. `image.valid`: %d, `alpha_mask.valid`: %d";
  }
  rf_log_impl(8,(rf_log_type)pcVar2,(char *)0x1,uVar1,uVar3);
  *(char **)(in_FS_OFFSET + -0x450) =
       "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
  ;
  *(char **)(in_FS_OFFSET + -0x448) = "rf_image_alpha_mask_to_buffer";
  *(undefined8 *)(in_FS_OFFSET + -0x440) = uVar4;
  *(undefined4 *)(in_FS_OFFSET + -0x438) = 1;
  return __return_storage_ptr__;
}

Assistant:

RF_API rf_image rf_image_alpha_mask_to_buffer(rf_image image, rf_image alpha_mask, void* dst, rf_int dst_size)
{
    rf_image result = {0};

    if (image.valid && alpha_mask.valid)
    {
        if (image.width == alpha_mask.width && image.height == alpha_mask.height)
        {
            if (rf_is_compressed_format(image.format) && alpha_mask.format == RF_UNCOMPRESSED_GRAYSCALE)
            {
                if (dst_size >= rf_image_size_in_format(image, RF_UNCOMPRESSED_GRAY_ALPHA))
                {
                    // Apply alpha mask to alpha channel
                    for (rf_int i = 0; i < image.width * image.height; i++)
                    {
                        unsigned char mask_pixel = 0;
                        rf_format_one_pixel(((unsigned char*)alpha_mask.data) + i, alpha_mask.format, &mask_pixel, RF_UNCOMPRESSED_GRAYSCALE);

                        // Todo: Finish implementing this function
                        //((unsigned char*)dst)[k] = mask_pixel;
                    }

                    result.data   = dst;
                    result.width  = image.width;
                    result.height = image.height;
                    result.format = RF_UNCOMPRESSED_GRAY_ALPHA;
                    result.valid  = true;
                }
            } else RF_LOG_ERROR(RF_BAD_ARGUMENT, "Expected compressed pixel formats. `image.format`: %d, `alpha_mask.format`: %d", image.format, alpha_mask.format);
        } else RF_LOG_ERROR(RF_BAD_ARGUMENT, "Alpha mask must be same size as image but was w: %d, h: %d", alpha_mask.width, alpha_mask.height);
    } else RF_LOG_ERROR(RF_BAD_ARGUMENT, "One image was invalid. `image.valid`: %d, `alpha_mask.valid`: %d", image.valid, alpha_mask.valid);

    return result;
}